

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes_hash.cpp
# Opt level: O2

void hashAndFillAes1Rx4<true>(void *scratchpad,size_t scratchpadSize,void *hash,void *fill_state)

{
  void *pvVar1;
  int i;
  int iVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  rx_vec_i128 in;
  rx_vec_i128 in_00;
  rx_vec_i128 in_01;
  rx_vec_i128 in_02;
  rx_vec_i128 in_03;
  rx_vec_i128 in_04;
  rx_vec_i128 in_05;
  rx_vec_i128 in_06;
  rx_vec_i128 in_07;
  rx_vec_i128 in_08;
  rx_vec_i128 in_09;
  rx_vec_i128 in_10;
  rx_vec_i128 in_11;
  rx_vec_i128 in_12;
  rx_vec_i128 in_13;
  rx_vec_i128 key;
  rx_vec_i128 key_00;
  rx_vec_i128 key_01;
  rx_vec_i128 key_02;
  rx_vec_i128 key_03;
  rx_vec_i128 key_04;
  rx_vec_i128 key_05;
  rx_vec_i128 key_06;
  rx_vec_i128 key_07;
  rx_vec_i128 key_08;
  rx_vec_i128 key_09;
  rx_vec_i128 key_10;
  rx_vec_i128 key_11;
  rx_vec_i128 key_12;
  rx_vec_i128 key_13;
  rx_vec_i128 key_14;
  rx_vec_i128 alVar6;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_88;
  undefined8 uStack_80;
  void *pvVar2;
  
  local_a8 = *fill_state;
  uStack_a0 = *(undefined8 *)((long)fill_state + 8);
  local_b8 = *(undefined8 *)((long)fill_state + 0x10);
  uStack_b0 = *(undefined8 *)((long)fill_state + 0x18);
  local_c8 = *(undefined8 *)((long)fill_state + 0x20);
  uStack_c0 = *(undefined8 *)((long)fill_state + 0x28);
  local_88 = *(undefined8 *)((long)fill_state + 0x30);
  uStack_80 = *(undefined8 *)((long)fill_state + 0x38);
  puVar4 = (undefined8 *)((long)scratchpad + (scratchpadSize - 0x1000));
  pvVar1 = fill_state;
  pvVar2 = hash;
  puVar5 = (undefined8 *)scratchpad;
  for (iVar3 = 0; iVar3 != 2; iVar3 = iVar3 + 1) {
    for (; puVar5 < puVar4; puVar5 = puVar5 + 8) {
      alVar6[1] = scratchpadSize;
      alVar6[0] = (longlong)scratchpad;
      key[1] = (longlong)pvVar1;
      key[0] = (longlong)pvVar2;
      alVar6 = soft_aesenc(alVar6,key);
      key_00[0] = alVar6[1];
      in[1] = scratchpadSize;
      in[0] = (longlong)scratchpad;
      key_00[1] = (longlong)pvVar1;
      alVar6 = soft_aesdec(in,key_00);
      key_01[0] = alVar6[1];
      in_00[1] = scratchpadSize;
      in_00[0] = (longlong)scratchpad;
      key_01[1] = (longlong)pvVar1;
      alVar6 = soft_aesenc(in_00,key_01);
      key_02[0] = alVar6[1];
      in_01[1] = scratchpadSize;
      in_01[0] = (longlong)scratchpad;
      key_02[1] = (longlong)pvVar1;
      alVar6 = soft_aesdec(in_01,key_02);
      key_03[0] = alVar6[1];
      in_02[1] = scratchpadSize;
      in_02[0] = (longlong)scratchpad;
      key_03[1] = (longlong)pvVar1;
      alVar6 = soft_aesdec(in_02,key_03);
      key_04[0] = alVar6[1];
      local_a8 = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      uStack_a0 = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc);
      in_03[1] = scratchpadSize;
      in_03[0] = (longlong)scratchpad;
      key_04[1] = (longlong)pvVar1;
      alVar6 = soft_aesenc(in_03,key_04);
      key_05[0] = alVar6[1];
      local_b8 = CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
      uStack_b0 = CONCAT44(extraout_XMM0_Dd_00,extraout_XMM0_Dc_00);
      in_04[1] = scratchpadSize;
      in_04[0] = (longlong)scratchpad;
      key_05[1] = (longlong)pvVar1;
      alVar6 = soft_aesdec(in_04,key_05);
      key_06[0] = alVar6[1];
      local_c8 = CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
      uStack_c0 = CONCAT44(extraout_XMM0_Dd_01,extraout_XMM0_Dc_01);
      in_05[1] = scratchpadSize;
      in_05[0] = (longlong)scratchpad;
      key_06[1] = (longlong)pvVar1;
      alVar6 = soft_aesenc(in_05,key_06);
      pvVar2 = alVar6[1];
      *puVar5 = local_a8;
      puVar5[1] = uStack_a0;
      puVar5[2] = local_b8;
      puVar5[3] = uStack_b0;
      puVar5[4] = local_c8;
      puVar5[5] = uStack_c0;
      local_88 = CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
      uStack_80 = CONCAT44(extraout_XMM0_Dd_02,extraout_XMM0_Dc_02);
      *(undefined4 *)(puVar5 + 6) = extraout_XMM0_Da_02;
      *(undefined4 *)((long)puVar5 + 0x34) = extraout_XMM0_Db_02;
      *(undefined4 *)(puVar5 + 7) = extraout_XMM0_Dc_02;
      *(undefined4 *)((long)puVar5 + 0x3c) = extraout_XMM0_Dd_02;
    }
    puVar4 = puVar4 + 0x200;
  }
  *(undefined8 *)fill_state = local_a8;
  *(undefined8 *)((long)fill_state + 8) = uStack_a0;
  *(undefined8 *)((long)fill_state + 0x10) = local_b8;
  *(undefined8 *)((long)fill_state + 0x18) = uStack_b0;
  *(undefined8 *)((long)fill_state + 0x20) = local_c8;
  *(undefined8 *)((long)fill_state + 0x28) = uStack_c0;
  *(undefined8 *)((long)fill_state + 0x30) = local_88;
  *(undefined8 *)((long)fill_state + 0x38) = uStack_80;
  in_06[1] = scratchpadSize;
  in_06[0] = (longlong)scratchpad;
  key_07[1] = (longlong)pvVar1;
  key_07[0] = (longlong)pvVar2;
  alVar6 = soft_aesenc(in_06,key_07);
  key_08[0] = alVar6[1];
  in_07[1] = scratchpadSize;
  in_07[0] = (longlong)scratchpad;
  key_08[1] = (longlong)pvVar1;
  alVar6 = soft_aesdec(in_07,key_08);
  key_09[0] = alVar6[1];
  in_08[1] = scratchpadSize;
  in_08[0] = (longlong)scratchpad;
  key_09[1] = (longlong)pvVar1;
  alVar6 = soft_aesenc(in_08,key_09);
  key_10[0] = alVar6[1];
  in_09[1] = scratchpadSize;
  in_09[0] = (longlong)scratchpad;
  key_10[1] = (longlong)pvVar1;
  alVar6 = soft_aesdec(in_09,key_10);
  key_11[0] = alVar6[1];
  in_10[1] = scratchpadSize;
  in_10[0] = (longlong)scratchpad;
  key_11[1] = (longlong)pvVar1;
  alVar6 = soft_aesenc(in_10,key_11);
  key_12[0] = alVar6[1];
  local_a8 = CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03);
  uStack_a0 = CONCAT44(extraout_XMM0_Dd_03,extraout_XMM0_Dc_03);
  in_11[1] = scratchpadSize;
  in_11[0] = (longlong)scratchpad;
  key_12[1] = (longlong)pvVar1;
  alVar6 = soft_aesdec(in_11,key_12);
  key_13[0] = alVar6[1];
  local_b8 = CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04);
  uStack_b0 = CONCAT44(extraout_XMM0_Dd_04,extraout_XMM0_Dc_04);
  in_12[1] = scratchpadSize;
  in_12[0] = (longlong)scratchpad;
  key_13[1] = (longlong)pvVar1;
  alVar6 = soft_aesenc(in_12,key_13);
  key_14[0] = alVar6[1];
  local_c8 = CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05);
  uStack_c0 = CONCAT44(extraout_XMM0_Dd_05,extraout_XMM0_Dc_05);
  in_13[1] = scratchpadSize;
  in_13[0] = (longlong)scratchpad;
  key_14[1] = (longlong)pvVar1;
  soft_aesdec(in_13,key_14);
  *(undefined8 *)hash = local_a8;
  *(undefined8 *)((long)hash + 8) = uStack_a0;
  *(undefined8 *)((long)hash + 0x10) = local_b8;
  *(undefined8 *)((long)hash + 0x18) = uStack_b0;
  *(undefined8 *)((long)hash + 0x20) = local_c8;
  *(undefined8 *)((long)hash + 0x28) = uStack_c0;
  *(undefined4 *)((long)hash + 0x30) = extraout_XMM0_Da_06;
  *(undefined4 *)((long)hash + 0x34) = extraout_XMM0_Db_06;
  *(undefined4 *)((long)hash + 0x38) = extraout_XMM0_Dc_06;
  *(undefined4 *)((long)hash + 0x3c) = extraout_XMM0_Dd_06;
  return;
}

Assistant:

void hashAndFillAes1Rx4(void *scratchpad, size_t scratchpadSize, void *hash, void* fill_state) {
	uint8_t* scratchpadPtr = (uint8_t*)scratchpad;
	const uint8_t* scratchpadEnd = scratchpadPtr + scratchpadSize;

	// initial state
	rx_vec_i128 hash_state0 = rx_set_int_vec_i128(AES_HASH_1R_STATE0);
	rx_vec_i128 hash_state1 = rx_set_int_vec_i128(AES_HASH_1R_STATE1);
	rx_vec_i128 hash_state2 = rx_set_int_vec_i128(AES_HASH_1R_STATE2);
	rx_vec_i128 hash_state3 = rx_set_int_vec_i128(AES_HASH_1R_STATE3);

	const rx_vec_i128 key0 = rx_set_int_vec_i128(AES_GEN_1R_KEY0);
	const rx_vec_i128 key1 = rx_set_int_vec_i128(AES_GEN_1R_KEY1);
	const rx_vec_i128 key2 = rx_set_int_vec_i128(AES_GEN_1R_KEY2);
	const rx_vec_i128 key3 = rx_set_int_vec_i128(AES_GEN_1R_KEY3);

	rx_vec_i128 fill_state0 = rx_load_vec_i128((rx_vec_i128*)fill_state + 0);
	rx_vec_i128 fill_state1 = rx_load_vec_i128((rx_vec_i128*)fill_state + 1);
	rx_vec_i128 fill_state2 = rx_load_vec_i128((rx_vec_i128*)fill_state + 2);
	rx_vec_i128 fill_state3 = rx_load_vec_i128((rx_vec_i128*)fill_state + 3);

	constexpr int PREFETCH_DISTANCE = 4096;
	const char* prefetchPtr = ((const char*)scratchpad) + PREFETCH_DISTANCE;
	scratchpadEnd -= PREFETCH_DISTANCE;

	for (int i = 0; i < 2; ++i) {
		//process 64 bytes at a time in 4 lanes
		while (scratchpadPtr < scratchpadEnd) {
			hash_state0 = aesenc<softAes>(hash_state0, rx_load_vec_i128((rx_vec_i128*)scratchpadPtr + 0));
			hash_state1 = aesdec<softAes>(hash_state1, rx_load_vec_i128((rx_vec_i128*)scratchpadPtr + 1));
			hash_state2 = aesenc<softAes>(hash_state2, rx_load_vec_i128((rx_vec_i128*)scratchpadPtr + 2));
			hash_state3 = aesdec<softAes>(hash_state3, rx_load_vec_i128((rx_vec_i128*)scratchpadPtr + 3));

			fill_state0 = aesdec<softAes>(fill_state0, key0);
			fill_state1 = aesenc<softAes>(fill_state1, key1);
			fill_state2 = aesdec<softAes>(fill_state2, key2);
			fill_state3 = aesenc<softAes>(fill_state3, key3);

			rx_store_vec_i128((rx_vec_i128*)scratchpadPtr + 0, fill_state0);
			rx_store_vec_i128((rx_vec_i128*)scratchpadPtr + 1, fill_state1);
			rx_store_vec_i128((rx_vec_i128*)scratchpadPtr + 2, fill_state2);
			rx_store_vec_i128((rx_vec_i128*)scratchpadPtr + 3, fill_state3);

			rx_prefetch_t0(prefetchPtr);

			scratchpadPtr += 64;
			prefetchPtr += 64;
		}
		prefetchPtr = (const char*) scratchpad;
		scratchpadEnd += PREFETCH_DISTANCE;
	}

	rx_store_vec_i128((rx_vec_i128*)fill_state + 0, fill_state0);
	rx_store_vec_i128((rx_vec_i128*)fill_state + 1, fill_state1);
	rx_store_vec_i128((rx_vec_i128*)fill_state + 2, fill_state2);
	rx_store_vec_i128((rx_vec_i128*)fill_state + 3, fill_state3);

	//two extra rounds to achieve full diffusion
	rx_vec_i128 xkey0 = rx_set_int_vec_i128(AES_HASH_1R_XKEY0);
	rx_vec_i128 xkey1 = rx_set_int_vec_i128(AES_HASH_1R_XKEY1);

	hash_state0 = aesenc<softAes>(hash_state0, xkey0);
	hash_state1 = aesdec<softAes>(hash_state1, xkey0);
	hash_state2 = aesenc<softAes>(hash_state2, xkey0);
	hash_state3 = aesdec<softAes>(hash_state3, xkey0);

	hash_state0 = aesenc<softAes>(hash_state0, xkey1);
	hash_state1 = aesdec<softAes>(hash_state1, xkey1);
	hash_state2 = aesenc<softAes>(hash_state2, xkey1);
	hash_state3 = aesdec<softAes>(hash_state3, xkey1);

	//output hash
	rx_store_vec_i128((rx_vec_i128*)hash + 0, hash_state0);
	rx_store_vec_i128((rx_vec_i128*)hash + 1, hash_state1);
	rx_store_vec_i128((rx_vec_i128*)hash + 2, hash_state2);
	rx_store_vec_i128((rx_vec_i128*)hash + 3, hash_state3);
}